

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O3

bool __thiscall Chainstate::LoadGenesisBlock(Chainstate *this)

{
  long lVar1;
  BlockManager *pBVar2;
  size_type sVar3;
  CBlockIndex *pindexNew;
  bool bVar4;
  CBlock *block;
  long in_FS_OFFSET;
  bool bVar5;
  string_view logging_function;
  string_view source_file;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock37;
  FlatFilePos blockPos;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  criticalblock37.super_unique_lock._M_device = &cs_main.super_recursive_mutex;
  criticalblock37.super_unique_lock._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&criticalblock37.super_unique_lock);
  pBVar2 = this->m_blockman;
  block = &((this->m_chainman->m_options).chainparams)->genesis;
  CBlockHeader::GetHash((uint256 *)&blockPos,&block->super_CBlockHeader);
  sVar3 = std::
          _Hashtable<uint256,_std::pair<const_uint256,_CBlockIndex>,_std::allocator<std::pair<const_uint256,_CBlockIndex>_>,_std::__detail::_Select1st,_std::equal_to<uint256>,_BlockHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::count(&(pBVar2->m_block_index)._M_h,(key_type *)&blockPos);
  bVar4 = true;
  if (sVar3 == 0) {
    blockPos = ::node::BlockManager::SaveBlockToDisk(this->m_blockman,block,0);
    bVar5 = blockPos.nFile == -1;
    bVar4 = !bVar5;
    if (bVar5) {
      logging_function._M_str = "LoadGenesisBlock";
      logging_function._M_len = 0x10;
      source_file._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
      ;
      source_file._M_len = 0x5e;
      LogPrintFormatInternal<char[17]>
                (logging_function,source_file,0x138c,ALL,Error,(ConstevalFormatString<1U>)0x80f204,
                 (char (*) [17])"LoadGenesisBlock");
    }
    else {
      pindexNew = ::node::BlockManager::AddToBlockIndex
                            (this->m_blockman,&block->super_CBlockHeader,
                             &this->m_chainman->m_best_header);
      ChainstateManager::ReceivedBlockTransactions(this->m_chainman,block,pindexNew,&blockPos);
    }
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock37.super_unique_lock);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar4;
  }
  __stack_chk_fail();
}

Assistant:

bool Chainstate::LoadGenesisBlock()
{
    LOCK(cs_main);

    const CChainParams& params{m_chainman.GetParams()};

    // Check whether we're already initialized by checking for genesis in
    // m_blockman.m_block_index. Note that we can't use m_chain here, since it is
    // set based on the coins db, not the block index db, which is the only
    // thing loaded at this point.
    if (m_blockman.m_block_index.count(params.GenesisBlock().GetHash()))
        return true;

    try {
        const CBlock& block = params.GenesisBlock();
        FlatFilePos blockPos{m_blockman.SaveBlockToDisk(block, 0)};
        if (blockPos.IsNull()) {
            LogError("%s: writing genesis block to disk failed\n", __func__);
            return false;
        }
        CBlockIndex* pindex = m_blockman.AddToBlockIndex(block, m_chainman.m_best_header);
        m_chainman.ReceivedBlockTransactions(block, pindex, blockPos);
    } catch (const std::runtime_error& e) {
        LogError("%s: failed to write genesis block: %s\n", __func__, e.what());
        return false;
    }

    return true;
}